

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 gauden_dist(gauden_t *g,int mgau,int32 n_top,mfcc_t **obs,gauden_dist_t **out_dist)

{
  int local_2c;
  int32 f;
  gauden_dist_t **out_dist_local;
  mfcc_t **obs_local;
  int32 n_top_local;
  int mgau_local;
  gauden_t *g_local;
  
  if ((0 < n_top) && (n_top <= g->n_density)) {
    for (local_2c = 0; local_2c < g->n_feat; local_2c = local_2c + 1) {
      compute_dist(out_dist[local_2c],n_top,obs[local_2c],g->featlen[local_2c],
                   g->mean[mgau][local_2c],g->var[mgau][local_2c],g->det[mgau][local_2c],
                   g->n_density);
    }
    return 0;
  }
  __assert_fail("(n_top > 0) && (n_top <= g->n_density)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                ,0x1f1,"int32 gauden_dist(gauden_t *, int, int32, mfcc_t **, gauden_dist_t **)");
}

Assistant:

int32
gauden_dist(gauden_t * g,
            int mgau, int32 n_top, mfcc_t** obs, gauden_dist_t ** out_dist)
{
    int32 f;

    assert((n_top > 0) && (n_top <= g->n_density));

    for (f = 0; f < g->n_feat; f++) {
        compute_dist(out_dist[f], n_top,
                     obs[f], g->featlen[f],
                     g->mean[mgau][f], g->var[mgau][f], g->det[mgau][f],
                     g->n_density);
        E_DEBUG("Top CW(%d,%d) = %d %d\n", mgau, f, out_dist[f][0].id,
                (int)out_dist[f][0].dist >> SENSCR_SHIFT);
    }

    return 0;
}